

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O2

void __thiscall ScopedTempDir::CreateAndEnter(ScopedTempDir *this,string *name)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  char *msg;
  char name_template [1024];
  allocator<char> local_419;
  string local_418 [1024];
  
  pcVar2 = getenv("TMPDIR");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "/tmp";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_418,pcVar2,&local_419);
  std::__cxx11::string::operator=((string *)this,local_418);
  std::__cxx11::string::~string(local_418);
  if ((this->start_dir_)._M_string_length == 0) {
    Fatal("couldn\'t get system temp dir");
  }
  iVar1 = chdir((this->start_dir_)._M_dataplus._M_p);
  if (-1 < iVar1) {
    strcpy((char *)local_418,(name->_M_dataplus)._M_p);
    sVar3 = strlen((char *)local_418);
    *(undefined8 *)(local_418 + sVar3) = 0x5858585858582d;
    pcVar2 = mkdtemp((char *)local_418);
    if (pcVar2 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      msg = "mkdtemp: %s";
      goto LAB_00172eff;
    }
    std::__cxx11::string::assign((char *)&this->temp_dir_name_);
    iVar1 = chdir((this->temp_dir_name_)._M_dataplus._M_p);
    if (-1 < iVar1) {
      return;
    }
  }
  piVar4 = __errno_location();
  pcVar2 = strerror(*piVar4);
  msg = "chdir: %s";
LAB_00172eff:
  Fatal(msg,pcVar2);
}

Assistant:

void ScopedTempDir::CreateAndEnter(const string& name) {
  // First change into the system temp dir and save it for cleanup.
  start_dir_ = GetSystemTempDir();
  if (start_dir_.empty())
    Fatal("couldn't get system temp dir");
  if (chdir(start_dir_.c_str()) < 0)
    Fatal("chdir: %s", strerror(errno));

  // Create a temporary subdirectory of that.
  char name_template[1024];
  strcpy(name_template, name.c_str());
  strcat(name_template, "-XXXXXX");
  char* tempname = mkdtemp(name_template);
  if (!tempname)
    Fatal("mkdtemp: %s", strerror(errno));
  temp_dir_name_ = tempname;

  // chdir into the new temporary directory.
  if (chdir(temp_dir_name_.c_str()) < 0)
    Fatal("chdir: %s", strerror(errno));
}